

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qunicodetools.cpp
# Opt level: O1

void __thiscall
QUnicodeTools::initCharAttributes
          (QUnicodeTools *this,QStringView string,ScriptItem *items,qsizetype numItems,
          QCharAttributes *attributes,CharAttributeOptions options)

{
  ushort uVar1;
  storage_type_conflict *psVar2;
  byte bVar3;
  int iVar4;
  State SVar5;
  uint uVar6;
  uint extraout_EAX;
  uint uVar7;
  Properties *pPVar8;
  QUnicodeTools *pQVar9;
  long lVar10;
  QUnicodeTools *pQVar11;
  uint uVar12;
  anon_class_4_1_898e463c_for__M_pred __pred;
  ulong uVar13;
  uint uVar14;
  anon_class_4_1_a85b8a8a_for__M_pred __pred_00;
  LineBreakClass LVar15;
  State state;
  QUnicodeTools *pQVar16;
  long lVar17;
  char32_t cVar18;
  char32_t ucs4;
  code *pcVar19;
  char cVar20;
  State oldState;
  LineBreakClass LVar21;
  ulong uVar22;
  qsizetype pos;
  ScriptItem *pSVar23;
  QUnicodeTools *pQVar24;
  ulong uVar25;
  long in_FS_OFFSET;
  bool bVar26;
  bool bVar27;
  QUnicodeTools *local_f0;
  uint local_bc;
  Properties *local_b8;
  QUnicodeTools *local_b0;
  Properties *local_a0;
  LineBreakClass local_78 [16];
  long local_38;
  
  lVar17 = string.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < (long)this) {
    if (((uint)attributes >> 0xc & 1) == 0) {
      memset((void *)numItems,0,(size_t)(this + 1));
    }
    if (((ulong)attributes & 1) != 0) {
      uVar22 = 2;
      cVar20 = '\0';
      pQVar24 = (QUnicodeTools *)0x0;
      do {
        uVar1 = *(ushort *)(lVar17 + (long)pQVar24 * 2);
        cVar18 = (char32_t)uVar1;
        pQVar11 = pQVar24;
        if ((((cVar18 & 0xfc00U) == 0xd800) && (pQVar24 + 1 != this)) &&
           (uVar12 = (uint)*(ushort *)(lVar17 + 2 + (long)pQVar24 * 2), (uVar12 & 0xfc00) == 0xdc00)
           ) {
          cVar18 = (uint)uVar1 * 0x400 + uVar12 + L'\xfca02400';
          pQVar11 = pQVar24 + 1;
        }
        pPVar8 = QUnicodeTables::properties(cVar18);
        uVar12 = *(uint *)&pPVar8->field_0x10 & 0x1f;
        uVar14 = 1 << (sbyte)uVar12 & (uint)*(ushort *)(GB::breakTable + uVar22 * 2);
        bVar26 = uVar14 == 0;
        if (cVar20 == '\x03') {
          bVar27 = uVar12 == 6;
LAB_0034485c:
          bVar26 = !bVar27 && uVar14 == 0;
          cVar20 = '\0';
        }
        else {
          if (cVar20 == '\x02') {
            bVar27 = uVar12 == 0xe;
            goto LAB_0034485c;
          }
          if (cVar20 == '\x01') {
            bVar27 = true;
            if (uVar12 == 4) {
              cVar20 = '\x01';
            }
            else {
              if (uVar12 != 5) {
                cVar20 = '\0';
                goto LAB_00344872;
              }
              cVar20 = '\x02';
            }
          }
          else {
LAB_00344872:
            bVar27 = false;
          }
        }
        if (!bVar27) {
          if ((int)uVar22 == 0xe) {
            if (uVar12 == 4) {
              cVar20 = '\x01';
            }
            else if (uVar12 == 5) {
              cVar20 = '\x02';
            }
          }
          else if (uVar12 == 6) {
            cVar20 = '\x03';
          }
        }
        if (bVar26) {
          pQVar24[numItems] = (QUnicodeTools)((byte)pQVar24[numItems] | 1);
        }
        pQVar24 = pQVar11 + 1;
        uVar22 = (ulong)uVar12;
      } while (pQVar24 != this);
      this[numItems] = (QUnicodeTools)((byte)this[numItems] | 1);
    }
    if (((ulong)attributes & 2) != 0) {
      initCharAttributes();
    }
    if (((ulong)attributes & 4) != 0) {
      uVar22 = 0xb;
      pQVar24 = (QUnicodeTools *)0x0;
      do {
        uVar1 = *(ushort *)(lVar17 + (long)pQVar24 * 2);
        cVar18 = (char32_t)uVar1;
        pQVar11 = pQVar24;
        if ((((cVar18 & 0xfc00U) == 0xd800) && (pQVar24 + 1 != this)) &&
           (uVar12 = (uint)*(ushort *)(lVar17 + 2 + (long)pQVar24 * 2), (uVar12 & 0xfc00) == 0xdc00)
           ) {
          cVar18 = (uint)uVar1 * 0x400 + uVar12 + L'\xfca02400';
          pQVar11 = pQVar24 + 1;
        }
        pPVar8 = QUnicodeTables::properties(cVar18);
        uVar25 = (ulong)(*(ushort *)&pPVar8->field_0x12 & 0xf);
        iVar4 = (int)uVar22;
        lVar10 = uVar22 * -2;
        uVar22 = (ulong)(byte)SB::breakTable[uVar25 + (ulong)(uint)(iVar4 << 4) + lVar10];
        if (SB::breakTable[uVar25 + (ulong)(uint)(iVar4 << 4) + lVar10] == 0xd) {
          uVar22 = 0xc;
          pQVar9 = pQVar11;
          do {
            pQVar16 = pQVar9 + 1;
            if ((long)this <= (long)pQVar16) break;
            uVar1 = *(ushort *)(lVar17 + 2 + (long)pQVar9 * 2);
            cVar18 = (char32_t)uVar1;
            if ((((cVar18 & 0xfc00U) == 0xd800) && (pQVar9 + 2 != this)) &&
               (uVar12 = (uint)*(ushort *)(lVar17 + 4 + (long)pQVar9 * 2),
               (uVar12 & 0xfc00) == 0xdc00)) {
              cVar18 = (uint)uVar1 * 0x400 + uVar12 + L'\xfca02400';
              pQVar16 = pQVar9 + 2;
            }
            pPVar8 = QUnicodeTables::properties(cVar18);
            uVar12 = *(ushort *)&pPVar8->field_0x12 & 0xf;
            if (uVar12 < 0xe) {
              bVar26 = true;
              if ((0x2a31U >> uVar12 & 1) == 0) {
                if (uVar12 != 6) goto LAB_00344a23;
                bVar26 = false;
                uVar22 = 0;
                pQVar11 = pQVar16;
              }
            }
            else {
LAB_00344a23:
              bVar26 = false;
            }
            pQVar9 = pQVar16;
          } while (bVar26);
        }
        if ((char)uVar22 == '\f') {
          pQVar24[numItems] = (QUnicodeTools)((byte)pQVar24[numItems] | 4);
          uVar22 = (ulong)(byte)SB::breakTable[uVar25];
        }
        pQVar24 = pQVar11 + 1;
      } while (pQVar24 != this);
      this[numItems] = (QUnicodeTools)((byte)this[numItems] | 4);
    }
    if (((ulong)attributes & 8) != 0) {
      local_a0 = QUnicodeTables::properties(L'\n');
      __pred.lcls = LineBreak_LF;
      local_b0 = (QUnicodeTools *)0x0;
      local_bc = 0;
      uVar12 = 0;
      LVar21 = LineBreak_LF;
      pQVar11 = (QUnicodeTools *)0x0;
      pQVar24 = (QUnicodeTools *)0x0;
      state = None;
      do {
        uVar1 = *(ushort *)(lVar17 + (long)pQVar11 * 2);
        cVar18 = (char32_t)uVar1;
        local_f0 = pQVar11;
        if ((((uVar1 & 0xfc00) == 0xd800) && (pQVar11 + 1 != this)) &&
           (uVar14 = (uint)*(ushort *)(lVar17 + 2 + (long)pQVar11 * 2), (uVar14 & 0xfc00) == 0xdc00)
           ) {
          cVar18 = (uint)uVar1 * 0x400 + uVar14 + L'\xfca02400';
          local_f0 = pQVar11 + 1;
        }
        local_b8 = QUnicodeTables::properties(cVar18);
        uVar14 = *(uint *)&local_b8->field_0x10 >> 10 & 0x3f;
        uVar25 = (ulong)uVar14;
        uVar22 = uVar25;
        if (((((ulong)attributes & 0x20) != 0) && (uVar22 = 0xf, 4 < uVar14 - 0x1d)) &&
           (((0x5f < (uint)(cVar18 + L'\xffffced0') || (uVar14 != 0x11)) &&
            ((uVar22 = uVar25, uVar14 == 0x2c &&
             ((undefined1  [20])((undefined1  [20])*local_b8 & (undefined1  [20])0x1e) ==
              (undefined1  [20])0x0)))))) {
          uVar22 = 0x1b;
        }
        if (((int)uVar22 == 0x2c) &&
           ((undefined1  [20])((undefined1  [20])*local_b8 & (undefined1  [20])0x1e) ==
            (undefined1  [20])0x0)) {
          uVar22 = 0x1b;
        }
        if ((int)uVar22 == 3) {
          if ((*(uint *)local_b8 & 0x1f) == 0x18) {
            __pred_00.nncls = LineBreak_LF;
            if ((long)(local_f0 + 1) < (long)this) {
              uVar1 = *(ushort *)(lVar17 + 2 + (long)local_f0 * 2);
              ucs4 = (char32_t)uVar1;
              if ((((ucs4 & 0xfc00U) == 0xd800) && ((long)(local_f0 + 2) < (long)this)) &&
                 (uVar14 = (uint)*(ushort *)(lVar17 + 4 + (long)local_f0 * 2),
                 (uVar14 & 0xfc00) == 0xdc00)) {
                ucs4 = (uint)uVar1 * 0x400 + uVar14 + L'\xfca02400';
              }
              pPVar8 = QUnicodeTables::properties(ucs4);
              __pred_00.nncls = *(uint *)&pPVar8->field_0x10 >> 10 & (LineBreak_LF|LineBreak_AL);
            }
            local_78[0] = LineBreak_SP;
            local_78[1] = LineBreak_GL;
            local_78[2] = LineBreak_WJ;
            local_78[3] = LineBreak_CL;
            local_78[4] = LineBreak_QU;
            local_78[5] = LineBreak_QU_Pi;
            local_78[6] = LineBreak_QU_Pf;
            local_78[7] = LineBreak_CP;
            local_78[8] = LineBreak_EX;
            local_78[9] = LineBreak_IS;
            local_78[10] = LineBreak_SY;
            local_78[0xb] = LineBreak_BK;
            local_78[0xc] = LineBreak_CR;
            local_78[0xd] = LineBreak_LF;
            local_78[0xe] = 0x1a;
            bVar26 = std::
                     any_of<QUnicodeTables::LineBreakClass_const*,QUnicodeTools::getLineBreaks(char16_t_const*,long_long,QCharAttributes*,QFlags<QUnicodeTools::CharAttributeOption>)::__2>
                               (local_78,local_78 + 0xf,__pred_00);
            if (bVar26) {
              uVar22 = 5;
            }
          }
          else if ((*(uint *)local_b8 & 0x1f) == 0x17) {
            local_78[0] = LineBreak_BK;
            local_78[1] = LineBreak_CR;
            local_78[2] = LineBreak_LF;
            local_78[3] = LineBreak_OP;
            local_78[4] = LineBreak_QU;
            local_78[5] = LineBreak_QU_Pi;
            local_78[6] = LineBreak_QU_Pf;
            local_78[7] = LineBreak_GL;
            local_78[8] = LineBreak_SP;
            local_78[9] = LineBreak_ZW;
            bVar26 = std::
                     any_of<QUnicodeTables::LineBreakClass_const*,QUnicodeTools::getLineBreaks(char16_t_const*,long_long,QCharAttributes*,QFlags<QUnicodeTools::CharAttributeOption>)::__1>
                               (local_78,local_78 + 10,__pred);
            if (bVar26) {
              uVar22 = 4;
            }
          }
        }
        if (((LineBreak_SG < __pred.lcls) ||
            ((__pred.lcls < LineBreak_EB && ((0x804000080U >> __pred.lcls & 1) != 0)))) &&
           ((cVar18 == L'‐' || ((int)uVar22 == 0x13)))) {
          uVar22 = (ulong)((uint)(cVar18 == L'‐') * 2 + 0x14);
        }
        LVar15 = (LineBreakClass)uVar22;
        uVar14 = uVar12;
        if ((LVar21 == LineBreak_AP) && (cVar18 == L'◌')) {
          LVar21 = LineBreak_AP;
          goto switchD_00344fab_default;
        }
        do {
          SVar5 = LB::BRS::updateState(state,(LinebreakUnit)(uVar22 | (ulong)(uint)cVar18 << 0x20));
          iVar4 = 7;
          bVar26 = SVar5 != state;
          state = SVar5;
          if (bVar26) {
            switch(SVar5) {
            case Start:
              pQVar24 = local_f0;
              break;
            case LB28a_2VF:
            case LB28a_3VIAK:
            case LB28a_4VF:
              pQVar9 = pQVar24 + 1;
              if ((long)pQVar9 < (long)local_f0) {
                do {
                  pQVar9[numItems] = (QUnicodeTools)((byte)pQVar9[numItems] & 0xf7);
                  pQVar9 = pQVar9 + 1;
                } while (local_f0 != pQVar9);
              }
              if (SVar5 == LB28a_3VIAK) {
                pQVar24 = local_f0;
              }
              iVar4 = 5;
              state = (uint)(SVar5 == LB28a_3VIAK);
              break;
            case LB28a_2VI:
              pQVar9 = pQVar24 + 1;
              iVar4 = 5;
              pQVar24 = local_f0;
              if ((long)pQVar9 < (long)local_f0) {
                do {
                  pQVar9[numItems] = (QUnicodeTools)((byte)pQVar9[numItems] & 0xf7);
                  pQVar9 = pQVar9 + 1;
                } while (local_f0 != pQVar9);
              }
              break;
            case Restart:
              iVar4 = 6;
              pQVar24 = pQVar11 + -1;
              state = Start;
            }
          }
        } while (iVar4 == 6);
        if (iVar4 == 5) goto switchD_00344fab_default;
        if (LVar15 == LineBreak_IS) {
          initCharAttributes();
          if ((short)extraout_EAX == 0) goto LAB_00344ca8;
          if ((extraout_EAX & 0xffff) == 1) goto LAB_003451df;
          bVar3 = 8;
          if ((extraout_EAX & 0xffff) == 2) goto LAB_00344c9f;
          goto switchD_00344fab_caseD_1;
        }
LAB_00344c9f:
        if (__pred.lcls == LineBreak_HL) {
LAB_003451df:
          if (LVar15 == LineBreak_BA) {
            uVar7 = (uint)((ulong)*(undefined8 *)local_b8 >> 0x35);
            bVar26 = (uVar7 & 7) != 2 && (uVar7 & 3) != 1;
          }
          else {
            bVar26 = false;
          }
          bVar27 = LVar15 == LineBreak_HY;
          if (bVar27 || bVar26) {
            uVar22 = 0x17;
          }
          LVar15 = (LineBreakClass)uVar22;
          if (bVar27 || bVar26) goto switchD_00344fab_default;
        }
LAB_00344ca8:
        bVar3 = 1;
        lVar10 = 1;
        uVar14 = 0;
        uVar7 = 0;
        switch(uVar22) {
        case 0:
          lVar10 = 2;
          uVar14 = 6;
          goto LAB_00344d10;
        case 1:
        case 2:
          lVar10 = 7;
          goto LAB_00344d10;
        default:
          uVar7 = 0;
          uVar14 = 0;
          lVar10 = 0;
          break;
        case 10:
          lVar10 = 5;
          goto LAB_00344d10;
        case 0xb:
          lVar10 = 6;
          uVar7 = 5;
          break;
        case 0xc:
        case 0xd:
          break;
        case 0xe:
          lVar10 = 4;
          uVar7 = 2;
          bVar3 = 0;
          uVar14 = 2;
          break;
        case 0x13:
          lVar10 = 3;
LAB_00344d10:
          uVar7 = 0;
        }
        uVar6 = (uint)lVar10;
        if ((bool)(uVar12 == 5 & bVar3)) {
          uVar14 = 0;
        }
        else if ((uVar12 != 4) && (uVar14 = uVar7, uVar12 != 6)) {
          uVar14 = (uint)(byte)LB::NS::actionTable[lVar10 + (ulong)local_bc * 8];
        }
        pQVar9 = local_b0;
        switch(uVar14) {
        case 1:
        case 4:
          pQVar9 = local_f0;
          local_bc = uVar6;
          if ((uVar12 - 1 < 2) && (local_b0 = local_b0 + 1, (long)local_b0 < (long)pQVar11)) {
            do {
              local_b0[numItems] = (QUnicodeTools)((byte)local_b0[numItems] & 0xf7);
              local_b0 = local_b0 + 1;
            } while (pQVar11 != local_b0);
          }
          break;
        case 2:
        case 5:
        case 6:
          local_bc = uVar6;
          break;
        case 3:
          local_b0 = local_b0 + 1;
          if ((long)local_b0 < (long)pQVar11) {
            do {
              local_b0[numItems] = (QUnicodeTools)((byte)local_b0[numItems] & 0xf7);
              local_b0 = local_b0 + 1;
            } while (pQVar11 != local_b0);
          }
        case 0:
          local_bc = 0;
        }
        if ((((int)uVar22 == 3) && (__pred.lcls != LineBreak_ZW)) && (__pred.lcls != LineBreak_SP))
        {
          uVar12 = (uint)((ulong)*(undefined8 *)local_a0 >> 0x35) & 7;
          if (((uVar12 < 6) && ((0x26U >> uVar12 & 1) != 0)) &&
             (0 < (long)(this + ~(ulong)local_f0))) {
            uVar1 = *(ushort *)(lVar17 + 2 + (long)local_f0 * 2);
            cVar18 = (char32_t)uVar1;
            if (((this + ~(ulong)local_f0 != (QUnicodeTools *)0x1) && ((cVar18 & 0xfc00U) == 0xd800)
                ) && (uVar12 = (uint)*(ushort *)(lVar17 + 4 + (long)local_f0 * 2),
                     (uVar12 & 0xfc00) == 0xdc00)) {
              cVar18 = (uint)uVar1 * 0x400 + uVar12 + L'\xfca02400';
            }
            pPVar8 = QUnicodeTables::properties(cVar18);
            uVar12 = *(uint *)&pPVar8->field_0x10 >> 10 & 0x3f;
            if ((0x2e < uVar12 || uVar12 == 0x1b) ||
               (uVar12 = (uint)((ulong)*(undefined8 *)pPVar8 >> 0x35),
               (uVar12 & 7) == 2 || (uVar12 & 3) == 1)) goto LAB_00344e75;
          }
          uVar22 = 6;
        }
LAB_00344e75:
        LVar15 = (LineBreakClass)uVar22;
        local_b0 = pQVar9;
        if (LineBreak_SP < __pred.lcls) {
          bVar3 = 0x88;
          if ((__pred.lcls != LineBreak_CR) || (LVar15 != LineBreak_LF))
          goto switchD_00344fab_caseD_1;
          goto switchD_00344fab_default;
        }
        uVar12 = uVar14;
        if (LineBreak_SG < LVar15) {
          if (LVar15 != LineBreak_SP) goto switchD_00344fab_default;
          goto LAB_0034507a;
        }
        if ((((LVar15 == LineBreak_QU_19) || (LVar15 == LineBreak_QU)) &&
            (((undefined1  [20])*local_b8 & (undefined1  [20])0x1f) != (undefined1  [20])0x17)) ||
           ((LVar21 == LineBreak_QU &&
            (((undefined1  [20])*local_a0 & (undefined1  [20])0x1f) != (undefined1  [20])0x18)))) {
          if (LVar15 != LineBreak_CM) {
            if ((__pred.lcls != LineBreak_SP) && (__pred.lcls != LineBreak_ZW))
            goto switchD_00344fab_default;
            goto LAB_00344ebd;
          }
LAB_00344ec7:
          if ((__pred.lcls != LineBreak_ZW) && (__pred.lcls != LineBreak_SP)) goto LAB_0034507a;
        }
        else {
LAB_00344ebd:
          if ((LVar15 == LineBreak_ZWJ) || (LVar15 == LineBreak_CM)) goto LAB_00344ec7;
          if (__pred.lcls == LineBreak_ZWJ) goto switchD_00344fab_default;
        }
        if ((__pred.lcls == LineBreak_RI) && (LVar15 == LineBreak_RI)) {
          LVar15 = LineBreak_SP;
          goto switchD_00344fab_default;
        }
        if (((LVar15 == LineBreak_EM) &&
            (((undefined1  [20])*local_a0 & (undefined1  [20])0x1f) == (undefined1  [20])0xd)) &&
           ((*(uint *)&local_a0->field_0x10 & 0x1f) == 0xe)) goto switchD_00344fab_default;
        if (LineBreak_ZWJ < LVar21) {
          LVar21 = LineBreak_AL;
        }
        if ((LVar21 == LineBreak_ZWJ) || (uVar25 = (ulong)LVar21, LVar21 == LineBreak_CM)) {
          local_a0 = QUnicodeTables::properties(L'A');
          uVar25 = 0xf;
        }
        if ((LVar15 == LineBreak_ZWJ) || (LVar15 == LineBreak_CM)) {
          local_b8 = QUnicodeTables::properties(L'A');
          uVar22 = 0xf;
        }
        LVar15 = (LineBreakClass)uVar22;
        uVar13 = 0xf;
        if (LVar15 < LineBreak_ZWJ) {
          uVar13 = uVar22;
        }
        bVar3 = 8;
        switch(LB::breakTable[uVar13 + uVar25 * 0x2b]) {
        case 2:
switchD_00344fab_caseD_2:
          if (__pred.lcls == LineBreak_SP) goto switchD_00344fab_caseD_1;
          break;
        case 3:
          if (__pred.lcls == LineBreak_SP) goto switchD_00344fab_caseD_1;
          goto LAB_0034507a;
        case 4:
          if (__pred.lcls != LineBreak_SP) goto LAB_0034507a;
          break;
        case 5:
          if (__pred.lcls != LineBreak_HL) goto switchD_00344fab_caseD_1;
          break;
        case 6:
          uVar12 = (uint)((ulong)*(undefined8 *)local_b8 >> 0x35) & 7;
          if ((5 < uVar12) || ((0x26U >> uVar12 & 1) == 0)) goto switchD_00344fab_caseD_2;
        case 1:
switchD_00344fab_caseD_1:
          pQVar11[numItems] = (QUnicodeTools)((byte)pQVar11[numItems] | bVar3);
          break;
        case 7:
          if (uVar14 - 4 < 0xfffffffd) goto switchD_00344fab_caseD_1;
        }
switchD_00344fab_default:
        uVar12 = uVar14;
        if ((LVar15 != LineBreak_CM) && (LVar15 != LineBreak_ZWJ)) {
          local_a0 = local_b8;
          LVar21 = LVar15;
        }
LAB_0034507a:
        __pred.lcls = LVar15;
        pQVar11 = local_f0 + 1;
      } while (pQVar11 != this);
      if ((LB::NS::actionTable[(ulong)local_bc * 8] == '\x03') &&
         (local_b0 = local_b0 + 1, (long)local_b0 < (long)this)) {
        do {
          local_b0[numItems] = (QUnicodeTools)((byte)local_b0[numItems] & 0xf7);
          local_b0 = local_b0 + 1;
        } while (this != local_b0);
      }
      *(byte *)numItems = *(byte *)numItems & 0x77;
      this[numItems] = (QUnicodeTools)((byte)this[numItems] | 0x88);
    }
    if (((ulong)attributes & 0x10) != 0) {
      pQVar24 = (QUnicodeTools *)0x0;
      do {
        uVar1 = *(ushort *)(lVar17 + (long)pQVar24 * 2);
        cVar18 = (char32_t)uVar1;
        if ((((cVar18 & 0xfc00U) == 0xd800) && (pQVar24 + 1 != this)) &&
           (uVar12 = (uint)*(ushort *)(lVar17 + 2 + (long)pQVar24 * 2), (uVar12 & 0xfc00) == 0xdc00)
           ) {
          cVar18 = (uint)uVar1 * 0x400 + uVar12 + L'\xfca02400';
          pQVar24 = pQVar24 + 1;
        }
        if ((((uint)(cVar18 + L'\xfffffff7') < 5) || (cVar18 == L' ')) ||
           ((0x7f < (uint)cVar18 &&
            (((cVar18 == L'\x85' || (cVar18 == L'\xa0')) ||
             (bVar26 = QChar::isSpace_helper(cVar18), bVar26)))))) {
          pQVar24[numItems] = (QUnicodeTools)((byte)pQVar24[numItems] | 0x10);
        }
        pQVar24 = pQVar24 + 1;
      } while (pQVar24 != this);
    }
    if (0 < (long)items && string.m_data != (storage_type_conflict *)0x0) {
      pSVar23 = (ScriptItem *)0x0;
      psVar2 = string.m_data;
      do {
        iVar4 = *(int *)(psVar2 + 4);
        if (iVar4 - 0xbU < 10) {
          bVar26 = false;
          pcVar19 = Tailored::indicAttributes;
        }
        else {
          bVar26 = true;
          if (iVar4 < 0x18) {
            if (iVar4 == 0x15) {
              bVar26 = false;
              pcVar19 = Tailored::thaiAttributes;
            }
            else {
              pcVar19 = (code *)0x0;
              if (iVar4 == 0x17) {
                bVar26 = false;
                pcVar19 = Tailored::tibetanAttributes;
              }
            }
          }
          else if (iVar4 == 0x18) {
            bVar26 = false;
            pcVar19 = Tailored::myanmarAttributes;
          }
          else {
            pcVar19 = (code *)0x0;
            if (iVar4 == 0x20) {
              bVar26 = false;
              pcVar19 = Tailored::khmerAttributes;
            }
          }
        }
        if (!bVar26) {
          pQVar24 = this;
          if ((long)pSVar23 < (long)&items[-1].field_0xf) {
            pQVar24 = *(QUnicodeTools **)(psVar2 + 8);
          }
          (*pcVar19)(iVar4,lVar17,*(long *)psVar2,(long)pQVar24 - *(long *)psVar2,numItems);
        }
        pSVar23 = (ScriptItem *)((long)&pSVar23->position + 1);
        psVar2 = psVar2 + 8;
      } while (items != pSVar23);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_CORE_EXPORT void initCharAttributes(QStringView string,
                                      const ScriptItem *items, qsizetype numItems,
                                      QCharAttributes *attributes, CharAttributeOptions options)
{
    if (string.size() <= 0)
        return;

    if (!(options & DontClearAttributes))
        ::memset(attributes, 0, (string.size() + 1) * sizeof(QCharAttributes));

    if (options & GraphemeBreaks)
        getGraphemeBreaks(string.utf16(), string.size(), attributes);
    if (options & WordBreaks)
        getWordBreaks(string.utf16(), string.size(), attributes);
    if (options & SentenceBreaks)
        getSentenceBreaks(string.utf16(), string.size(), attributes);
    if (options & LineBreaks)
        getLineBreaks(string.utf16(), string.size(), attributes, options);
    if (options & WhiteSpaces)
        getWhiteSpaces(string.utf16(), string.size(), attributes);

    if (!qt_initcharattributes_default_algorithm_only) {
        if (!items || numItems <= 0)
            return;

        Tailored::getCharAttributes(string.utf16(), string.size(), items, numItems, attributes);
    }
}